

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

int f64_compare(float64 xa,float64 xb,_Bool is_quiet,float_status *s)

{
  int iVar1;
  
  if (s->flush_inputs_to_zero != '\0') {
    if ((xa & 0x7fffffffffffffff) != 0 && (xa & 0x7ff0000000000000) == 0) {
      xa = xa & 0x8000000000000000;
      s->float_exception_flags = s->float_exception_flags | 0x40;
    }
    if ((xb & 0x7fffffffffffffff) != 0 && (xb & 0x7ff0000000000000) == 0) {
      xb = xb & 0x8000000000000000;
      s->float_exception_flags = s->float_exception_flags | 0x40;
    }
  }
  if ((double)xa < (double)xb) {
    if ((double)xa < (double)xb) {
      return -1;
    }
    iVar1 = soft_f64_compare(xa,xb,is_quiet,s);
    return iVar1;
  }
  return (int)((double)xb < (double)xa);
}

Assistant:

static int QEMU_FLATTEN
f64_compare(float64 xa, float64 xb, bool is_quiet, float_status *s)
{
    union_float64 ua, ub;

    ua.s = xa;
    ub.s = xb;

    if (QEMU_NO_HARDFLOAT) {
        goto soft;
    }

    float64_input_flush2(&ua.s, &ub.s, s);
    if (isgreaterequal(ua.h, ub.h)) {
        if (isgreater(ua.h, ub.h)) {
            return float_relation_greater;
        }
        return float_relation_equal;
    }
    if (likely(isless(ua.h, ub.h))) {
        return float_relation_less;
    }
    /* The only condition remaining is unordered.
     * Fall through to set flags.
     */
 soft:
    return soft_f64_compare(ua.s, ub.s, is_quiet, s);
}